

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg * __thiscall
fmt::v5::
basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::get(format_arg *__return_storage_ptr__,
     basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
     *this,size_type index)

{
  named_arg_base<char> *this_00;
  undefined1 local_38 [8];
  format_arg arg;
  size_type index_local;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *this_local;
  
  arg._28_4_ = index;
  do_get((format_arg *)local_38,this,index);
  if (arg.value_.field_0.string.size._0_4_ == 1) {
    this_00 = internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              ::as_named_arg((value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                              *)local_38);
    internal::named_arg_base<char>::
    deserialize<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              (__return_storage_ptr__,this_00);
  }
  else {
    (__return_storage_ptr__->value_).field_0.long_long_value = (longlong)local_38;
    (__return_storage_ptr__->value_).field_0.string.size = arg.value_.field_0.long_long_value;
    *(ulong *)&__return_storage_ptr__->type_ =
         CONCAT44(arg.value_.field_0.string.size._4_4_,arg.value_.field_0.string.size._0_4_);
    *(type *)&__return_storage_ptr__->field_0x18 = arg.type_;
    *(undefined4 *)&__return_storage_ptr__->field_0x1c = arg._20_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

format_arg get(size_type index) const {
    format_arg arg = do_get(index);
    return arg.type_ == internal::named_arg_type ?
          arg.value_.as_named_arg().template deserialize<Context>() : arg;
  }